

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psintrp.c
# Opt level: O1

void cf2_doFlex(CF2_Stack opStack,CF2_F16Dot16 *curX,CF2_F16Dot16 *curY,CF2_GlyphPath glyphPath,
               FT_Bool *readFromStack,FT_Bool doConditionalLastRead)

{
  FT_Bool FVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  CF2_F16Dot16 CVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  FT_UFast idx;
  undefined7 in_register_00000089;
  int *piVar9;
  CF2_GlyphPath glyphpath;
  undefined8 uStackY_a0;
  CF2_F16Dot16 CStack_94;
  undefined8 local_90;
  CF2_F16Dot16 local_88 [2];
  int aiStack_80 [8];
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int *local_50;
  CF2_GlyphPath local_48;
  CF2_Stack local_40;
  int local_38;
  FT_Bool local_31;
  
  local_38 = (int)CONCAT71(in_register_00000089,doConditionalLastRead);
  local_48 = glyphPath;
  local_40 = opStack;
  local_88[0] = *curX;
  local_50 = curY;
  local_88[1] = *curY;
  FVar1 = readFromStack[9];
  local_31 = FVar1;
  lVar8 = 0;
  idx = 0;
  local_90 = curX;
  do {
    iVar2 = local_88[lVar8];
    aiStack_80[lVar8] = iVar2;
    if (readFromStack[lVar8] != '\0') {
      uStackY_a0 = 0x211374;
      CVar5 = cf2_stack_getReal(local_40,idx);
      aiStack_80[lVar8] = CVar5 + iVar2;
      idx = idx + 1;
    }
    piVar9 = local_50;
    piVar4 = local_90;
    lVar8 = lVar8 + 1;
  } while (10 - (ulong)(FVar1 == '\0') != lVar8);
  if (local_31 == '\0') {
    local_5c = *local_50;
  }
  iVar2 = local_5c;
  if ((char)local_38 == '\0') {
    if (readFromStack[10] == '\0') {
      local_58 = *local_90;
    }
    else {
      uStackY_a0 = 0x211403;
      CVar5 = cf2_stack_getReal(local_40,idx);
      local_58 = CVar5 + local_60;
      idx = idx + 1;
    }
    glyphpath = local_48;
    iVar2 = local_5c;
    if (readFromStack[0xb] == '\0') {
      local_54 = *local_50;
      piVar9 = local_50;
    }
    else {
      uStackY_a0 = 0x21143c;
      CVar5 = cf2_stack_getReal(local_40,idx);
      local_54 = CVar5 + iVar2;
      piVar9 = local_50;
    }
  }
  else {
    local_38 = local_60;
    iVar6 = local_60 - *local_90;
    iVar3 = -iVar6;
    if (0 < iVar6) {
      iVar3 = iVar6;
    }
    iVar7 = local_5c - *local_50;
    iVar6 = -iVar7;
    if (0 < iVar7) {
      iVar6 = iVar7;
    }
    uStackY_a0 = 0x2113db;
    CVar5 = cf2_stack_getReal(local_40,idx);
    if (iVar6 < iVar3) {
      local_58 = CVar5 + local_38;
      local_54 = *piVar9;
    }
    else {
      local_58 = *piVar4;
      local_54 = CVar5 + iVar2;
    }
    glyphpath = local_48;
  }
  lVar8 = 0x1c;
  do {
    uStackY_a0 = 0x21148b;
    cf2_glyphpath_curveTo
              (glyphpath,*(CF2_F16Dot16 *)((long)&uStackY_a0 + lVar8 + 4),
               *(CF2_F16Dot16 *)((long)aiStack_80 + lVar8 + -0x18),
               *(CF2_F16Dot16 *)((long)&CStack_94 + lVar8),
               *(CF2_F16Dot16 *)((long)local_88 + lVar8 + -8),
               *(CF2_F16Dot16 *)((long)local_88 + lVar8 + -4),
               *(CF2_F16Dot16 *)((long)local_88 + lVar8));
    lVar8 = lVar8 + 0x18;
  } while (lVar8 == 0x34);
  local_40->top = local_40->buffer;
  *piVar4 = local_58;
  *piVar9 = local_54;
  return;
}

Assistant:

static void
  cf2_doFlex( CF2_Stack       opStack,
              CF2_Fixed*      curX,
              CF2_Fixed*      curY,
              CF2_GlyphPath   glyphPath,
              const FT_Bool*  readFromStack,
              FT_Bool         doConditionalLastRead )
  {
    CF2_Fixed  vals[14];
    CF2_UInt   idx;
    FT_Bool    isHFlex;
    CF2_Int    top, i, j;


    vals[0] = *curX;
    vals[1] = *curY;
    idx     = 0;
    isHFlex = FT_BOOL( readFromStack[9] == FALSE );
    top     = isHFlex ? 9 : 10;

    for ( i = 0; i < top; i++ )
    {
      vals[i + 2] = vals[i];
      if ( readFromStack[i] )
        vals[i + 2] = ADD_INT32( vals[i + 2], cf2_stack_getReal( opStack,
                                                                 idx++ ) );
    }

    if ( isHFlex )
      vals[9 + 2] = *curY;

    if ( doConditionalLastRead )
    {
      FT_Bool    lastIsX = (FT_Bool)(
                             cf2_fixedAbs( SUB_INT32( vals[10], *curX ) ) >
                             cf2_fixedAbs( SUB_INT32( vals[11], *curY ) ) );
      CF2_Fixed  lastVal = cf2_stack_getReal( opStack, idx );


      if ( lastIsX )
      {
        vals[12] = ADD_INT32( vals[10], lastVal );
        vals[13] = *curY;
      }
      else
      {
        vals[12] = *curX;
        vals[13] = ADD_INT32( vals[11], lastVal );
      }
    }
    else
    {
      if ( readFromStack[10] )
        vals[12] = ADD_INT32( vals[10],
                              cf2_stack_getReal( opStack, idx++ ) );
      else
        vals[12] = *curX;

      if ( readFromStack[11] )
        vals[13] = ADD_INT32( vals[11],
                              cf2_stack_getReal( opStack, idx ) );
      else
        vals[13] = *curY;
    }

    for ( j = 0; j < 2; j++ )
      cf2_glyphpath_curveTo( glyphPath, vals[j * 6 + 2],
                                        vals[j * 6 + 3],
                                        vals[j * 6 + 4],
                                        vals[j * 6 + 5],
                                        vals[j * 6 + 6],
                                        vals[j * 6 + 7] );

    cf2_stack_clear( opStack );

    *curX = vals[12];
    *curY = vals[13];
  }